

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simd_alignment_engine_implementation.hpp
# Opt level: O3

void __thiscall
spoa::SimdAlignmentEngine<(spoa::Architecture)3>::Prealloc
          (SimdAlignmentEngine<(spoa::Architecture)3> *this,uint32_t max_sequence_len,
          uint8_t alphabet_size)

{
  int64_t iVar1;
  invalid_argument *this_00;
  uint64_t matrix_height;
  
  if (-1 < (int)max_sequence_len) {
    matrix_height = (ulong)alphabet_size * (ulong)max_sequence_len;
    iVar1 = AlignmentEngine::WorstCaseAlignmentScore
                      (&this->super_AlignmentEngine,(ulong)max_sequence_len + 8,matrix_height);
    if (-0x7ffffc01 < iVar1) {
      if (iVar1 < -0x7c00) {
        Realloc(this,(ulong)((max_sequence_len >> 3) + 1),matrix_height,alphabet_size);
      }
      else {
        Realloc(this,(ulong)((max_sequence_len >> 4) + 1),matrix_height,alphabet_size);
      }
    }
    return;
  }
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument
            (this_00,"[spoa::SimdAlignmentEngine::Prealloc] error: too large sequence!");
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

void SimdAlignmentEngine<A>::Prealloc(
    std::uint32_t max_sequence_len,
    std::uint8_t alphabet_size) {
  if (max_sequence_len > std::numeric_limits<int32_t>::max()) {
    throw std::invalid_argument(
        "[spoa::SimdAlignmentEngine::Prealloc] error: too large sequence!");
  }

#if defined(__AVX2__) || defined(__SSE4_1__) || defined(SPOA_USE_SIMDE)

  std::int64_t worst_case_score = WorstCaseAlignmentScore(
      static_cast<std::int64_t>(max_sequence_len) + 8,
      static_cast<std::int64_t>(max_sequence_len) * alphabet_size);

  if (worst_case_score < std::numeric_limits<std::int32_t>::min() + 1024) {
    return;
  } else if (worst_case_score < std::numeric_limits<std::int16_t>::min() + 1024) {  // NOLINT
    try {
      Realloc(
          (max_sequence_len / InstructionSet<A, std::int32_t>::kNumVar) + 1,
          static_cast<std::uint64_t>(max_sequence_len) * alphabet_size,
          alphabet_size);
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Prealloc] error: insufficient memory!");
    }
  } else {
    try {
      Realloc(
          (max_sequence_len / InstructionSet<A, std::int16_t>::kNumVar) + 1,
          static_cast<std::uint64_t>(max_sequence_len) * alphabet_size,
          alphabet_size);
    } catch (std::bad_alloc& ba) {
      throw std::invalid_argument(
          "[spoa::SimdAlignmentEngine::Prealloc] error: insufficient memory!");
    }
  }

#endif
  (void) alphabet_size;
}